

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::getFormattedDuration_abi_cxx11_(string *__return_storage_ptr__,Catch *this,double duration)

{
  allocator<char> local_16d;
  ErrnoGuard local_16c;
  char local_168 [4];
  ErrnoGuard guard;
  char buffer [314];
  size_t maxDoubleSize;
  double duration_local;
  
  ErrnoGuard::ErrnoGuard(&local_16c);
  sprintf(local_168,"%.3f",duration);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_168,&local_16d);
  std::allocator<char>::~allocator(&local_16d);
  ErrnoGuard::~ErrnoGuard(&local_16c);
  return __return_storage_ptr__;
}

Assistant:

std::string getFormattedDuration( double duration ) {
        // Max exponent + 1 is required to represent the whole part
        // + 1 for decimal point
        // + 3 for the 3 decimal places
        // + 1 for null terminator
        const std::size_t maxDoubleSize = DBL_MAX_10_EXP + 1 + 1 + 3 + 1;
        char buffer[maxDoubleSize];

        // Save previous errno, to prevent sprintf from overwriting it
        ErrnoGuard guard;
#ifdef _MSC_VER
        sprintf_s(buffer, "%.3f", duration);
#else
        std::sprintf(buffer, "%.3f", duration);
#endif
        return std::string(buffer);
    }